

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O3

QDistanceFieldData * QDistanceFieldData::create(QSize size,QPainterPath *path,bool doubleResolution)

{
  QPoint *pQVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  uint width;
  void *pvVar5;
  QPoint *pQVar6;
  undefined1 auVar7 [16];
  QPoint *pQVar8;
  qsizetype qVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  qint32 *bits;
  ulong uVar15;
  QPoint *pQVar16;
  qint32 *pqVar17;
  uchar *puVar18;
  int y_7;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  undefined7 in_register_00000011;
  int y_1;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  int iVar28;
  int iVar29;
  qreal *pqVar30;
  long lVar31;
  QTransform *pQVar32;
  uint *puVar33;
  QArrayData *pQVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int y;
  uint uVar39;
  uint uVar40;
  int y_3;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  Representation RVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  int *oldD;
  ulong uVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  int iVar57;
  QPoint QVar58;
  ulong uVar59;
  int iVar60;
  long lVar61;
  long in_FS_OFFSET;
  byte bVar62;
  undefined1 auVar63 [16];
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  QByteArrayView QVar71;
  uint local_30b4;
  int local_309c;
  int local_3098;
  int local_3080;
  uint local_3070;
  int local_3064;
  int *local_3050;
  int *local_3048;
  Representation *local_3040;
  Representation *local_3038;
  QPoint *local_3028;
  QPoint *local_3020;
  Representation *local_3018;
  QPoint local_3000;
  QPoint *local_2ff8;
  long local_2ff0;
  QDistanceFieldData *local_2fe8;
  Representation *local_2fe0;
  Representation local_2fd4;
  qint32 *local_2fd0;
  QPoint *local_2fc8;
  int local_2fc0;
  undefined1 local_2fbc [12];
  uint *local_2fb0;
  Representation *local_2fa8;
  long local_2fa0;
  uint local_2f94;
  int local_2f90;
  int local_2f8c;
  Representation *local_2f88;
  undefined1 *local_2f80;
  Representation *local_2f78;
  double local_2f70;
  ulong local_2f68;
  ulong local_2f60;
  QSize size_local;
  QPoint local_2f50;
  QDataBuffer<QPoint> local_2f48;
  QDataBuffer<unsigned_int> local_2f28;
  QPoint local_2f08;
  QVLABase<bool> local_2f00;
  undefined1 local_2ee8 [256];
  QVLABase<bool> local_2de8;
  undefined1 local_2dd0 [256];
  QVLABase<QPoint> local_2cd0;
  undefined1 local_2cb8 [2048];
  QVLABase<QPoint> local_24b8;
  undefined1 local_24a0 [2048];
  QTransform transform;
  undefined1 local_1c50 [8];
  int iStack_1c48;
  undefined4 uStack_1c44;
  QPoint QStack_1c40;
  char *local_1c38 [896];
  long local_38;
  
  bVar62 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  size_local = size;
  local_2fe8 = create(&size_local);
  initialDistanceFieldFactor();
  iVar19 = QT_DISTANCEFIELD_DEFAULT_SCALE;
  if ((int)CONCAT71(in_register_00000011,doubleResolution) == 0) {
    initialDistanceFieldFactor();
    iVar57 = QT_DISTANCEFIELD_DEFAULT_RADIUS;
    initialDistanceFieldFactor();
    iVar25 = QT_DISTANCEFIELD_DEFAULT_SCALE;
  }
  else {
    iVar19 = QT_DISTANCEFIELD_DEFAULT_SCALE / 2;
    initialDistanceFieldFactor();
    iVar57 = QT_DISTANCEFIELD_DEFAULT_RADIUS / 2;
    initialDistanceFieldFactor();
    iVar25 = QT_DISTANCEFIELD_DEFAULT_SCALE / 2;
  }
  iVar57 = iVar57 / iVar25;
  puVar18 = local_2fe8->data;
  if (puVar18 == (uchar *)0x0) goto LAB_0047daea;
  bVar10 = QPainterPath::isEmpty(path);
  if (bVar10) {
    memset(puVar18,0,(long)local_2fe8->nbytes);
    goto LAB_0047daea;
  }
  width = local_2fe8->width;
  iVar25 = local_2fe8->height;
  pqVar30 = (qreal *)&DAT_006a5f38;
  pQVar32 = &transform;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    pQVar32->m_matrix[0][0] = *pqVar30;
    pqVar30 = pqVar30 + (ulong)bVar62 * -2 + 1;
    pQVar32 = (QTransform *)((long)pQVar32 + ((ulong)bVar62 * -2 + 1) * 8);
  }
  pqVar30 = (qreal *)&DAT_006a5ef0;
  pQVar32 = &transform;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    pQVar32->m_matrix[0][0] = *pqVar30;
    pqVar30 = pqVar30 + (ulong)bVar62 * -2 + 1;
    pQVar32 = (QTransform *)((long)pQVar32 + ((ulong)bVar62 * -2 + 1) * 8);
  }
  transform._72_2_ = 0xa800;
  QTransform::translate(&transform,(double)iVar57,(double)iVar57);
  QTransform::scale(&transform,1.0 / (double)iVar19,1.0 / (double)iVar19);
  local_2f28.buffer = (uint *)0x0;
  local_2f28.capacity = 0;
  local_2f28.siz = 0;
  local_2f48.buffer = (QPoint *)0x0;
  local_2f48.capacity = 0;
  local_2f48.siz = 0;
  qSimplifyPath(path,&local_2f48,&local_2f28,&transform);
  if (local_2f48.siz == 0) {
    lcDistanceField();
    if (((byte)lcDistanceField::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
        0) {
      local_1c50._0_4_ = 2;
      local_1c50._4_4_ = 0;
      iStack_1c48 = 0;
      uStack_1c44 = 0;
      QStack_1c40.xp.m_i = 0;
      QStack_1c40.yp.m_i = 0;
      local_1c38[0] = lcDistanceField::category.name;
      QMessageLogger::warning();
      qVar9 = local_2cd0.super_QVLABaseBase.a;
      QVar71.m_data = (storage_type *)0x2c;
      QVar71.m_size = (qsizetype)&local_24b8;
      QString::fromUtf8(QVar71);
      QTextStream::operator<<((QTextStream *)qVar9,(QString *)&local_24b8);
      if ((QArrayData *)local_24b8.super_QVLABaseBase.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_24b8.super_QVLABaseBase.a)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)local_24b8.super_QVLABaseBase.a)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_24b8.super_QVLABaseBase.a)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_24b8.super_QVLABaseBase.a,2,0x10);
        }
      }
      if (*(QTextStream *)(local_2cd0.super_QVLABaseBase.a + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_2cd0.super_QVLABaseBase.a,' ');
      }
      QDebug::~QDebug((QDebug *)&local_2cd0);
      puVar18 = local_2fe8->data;
    }
    memset(puVar18,0,(long)local_2fe8->nbytes);
  }
  else {
    uVar23 = iVar25 * width;
    uVar15 = 0xffffffffffffffff;
    if (-1 < (int)uVar23) {
      uVar15 = (long)(int)uVar23 * 4;
    }
    local_2ff0 = (long)iVar25;
    bits = (qint32 *)operator_new__(uVar15);
    auVar7 = _DAT_00674850;
    if (0 < (int)uVar23) {
      lVar20 = (ulong)uVar23 - 1;
      auVar63._8_4_ = (int)lVar20;
      auVar63._0_8_ = lVar20;
      auVar63._12_4_ = (int)((ulong)lVar20 >> 0x20);
      uVar15 = 0;
      auVar63 = auVar63 ^ _DAT_00674850;
      auVar65 = _DAT_00674830;
      auVar66 = _DAT_00674840;
      do {
        auVar70 = auVar66 ^ auVar7;
        iVar19 = auVar63._4_4_;
        if ((bool)(~(auVar70._4_4_ == iVar19 && auVar63._0_4_ < auVar70._0_4_ ||
                    iVar19 < auVar70._4_4_) & 1)) {
          bits[uVar15] = 0x7f80;
        }
        if ((auVar70._12_4_ != auVar63._12_4_ || auVar70._8_4_ <= auVar63._8_4_) &&
            auVar70._12_4_ <= auVar63._12_4_) {
          bits[uVar15 + 1] = 0x7f80;
        }
        auVar70 = auVar65 ^ auVar7;
        iVar25 = auVar70._4_4_;
        if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar70._0_4_ <= auVar63._0_4_)) {
          bits[uVar15 + 2] = 0x7f80;
          bits[uVar15 + 3] = 0x7f80;
        }
        uVar15 = uVar15 + 4;
        lVar20 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + 4;
        auVar66._8_8_ = lVar20 + 4;
        lVar20 = auVar65._8_8_;
        auVar65._0_8_ = auVar65._0_8_ + 4;
        auVar65._8_8_ = lVar20 + 4;
      } while ((uVar23 + 3 & 0xfffffffc) != uVar15);
    }
    local_2fb0 = local_2f28.buffer;
    memset(local_24a0,0xaa,0x800);
    local_24b8.super_QVLABaseBase.a = 0x100;
    local_24b8.super_QVLABaseBase.s = 0;
    local_24b8.super_QVLABaseBase.ptr = local_24a0;
    memset(local_2cb8,0xaa,0x800);
    local_2cd0.super_QVLABaseBase.a = 0x100;
    local_2cd0.super_QVLABaseBase.s = 0;
    local_2cd0.super_QVLABaseBase.ptr = local_2cb8;
    memset(local_2dd0,0xaa,0x100);
    local_2de8.super_QVLABaseBase.a = 0x100;
    local_2de8.super_QVLABaseBase.s = 0;
    local_2de8.super_QVLABaseBase.ptr = local_2dd0;
    memset(local_2ee8,0xaa,0x100);
    pQVar8 = local_2f48.buffer;
    local_2f00.super_QVLABaseBase.a = 0x100;
    local_2f00.super_QVLABaseBase.s = 0;
    iVar19 = (int)local_2f28.siz;
    local_2f00.super_QVLABaseBase.ptr = local_2ee8;
    memset(local_1c38,0xaa,0x1c00);
    lVar20 = local_2ff0;
    local_1c50._0_4_ = 0x80;
    local_1c50._4_4_ = 0;
    iStack_1c48 = 0;
    uStack_1c44 = 0;
    iVar25 = (int)local_2ff0;
    QStack_1c40 = (QPoint)local_1c38;
    if (iVar25 < 0x81) {
      QVar58 = (QPoint)local_1c38;
      if (0 < iVar25) goto LAB_0047af6d;
    }
    else {
      create();
      QVar58 = local_2f08;
LAB_0047af6d:
      uVar15 = lVar20 + 1;
      do {
        *(undefined8 *)QVar58 = 0x10;
        *(qsizetype *)((long)QVar58 + 8) = 0;
        *(QVLAStorage<2UL,_2UL,_16LL> **)((long)QVar58 + 0x10) =
             (QVLAStorage<2UL,_2UL,_16LL> *)((long)QVar58 + 0x18);
        uVar15 = uVar15 - 1;
        QVar58 = (QPoint)((long)QVar58 + 0x38);
      } while (1 < uVar15);
    }
    uStack_1c44 = (undefined4)((ulong)lVar20 >> 0x20);
    iStack_1c48 = iVar25;
    if (1 < iVar19) {
      iVar49 = 1;
      iVar25 = 0;
      do {
        uVar23 = local_2fb0[iVar49];
        iVar48 = iVar49;
        if (uVar23 == 0xffffffff) {
          uVar23 = local_2fb0[iVar25];
          iVar48 = iVar49 + 1;
          iVar25 = iVar48;
        }
        pQVar1 = pQVar8 + local_2fb0[(long)iVar49 + -1];
        pQVar6 = pQVar8 + uVar23;
        pQVar16 = pQVar1;
        if ((pQVar6->yp).m_i < (pQVar1->yp).m_i) {
          pQVar16 = pQVar6;
          pQVar6 = pQVar1;
        }
        iVar49 = (pQVar16->yp).m_i;
        uVar15 = (ulong)(uint)(iVar49 >> 8);
        if (iVar49 >> 8 < 1) {
          uVar15 = 0;
        }
        iVar35 = (pQVar6->yp).m_i;
        uVar23 = iVar35 >> 8;
        if ((int)(uint)lVar20 <= (int)uVar23) {
          uVar23 = (uint)lVar20;
        }
        if ((int)uVar15 < (int)uVar23) {
          iVar24 = (pQVar16->xp).m_i;
          iVar41 = (pQVar6->xp).m_i - iVar24;
          iVar35 = iVar35 - iVar49;
          iVar24 = ((((int)uVar15 * 0x100 - iVar49) + 0xff) * iVar41) / iVar35 + iVar24;
          lVar20 = uVar15 * 0x38;
          lVar61 = uVar23 - uVar15;
          do {
            if ((uint)(iVar24 >> 8) < width) {
              local_2f08.xp.m_i._0_2_ = (short)((uint)iVar24 >> 8);
              QVLABase<unsigned_short>::emplace_back_impl<unsigned_short>
                        ((QVLABase<unsigned_short> *)((long)QStack_1c40 + lVar20),0x10,
                         (undefined1 *)((long)QStack_1c40 + lVar20) + 0x18,
                         (unsigned_short *)&local_2f08);
            }
            iVar24 = iVar24 + (iVar41 * 0x100) / iVar35;
            lVar20 = lVar20 + 0x38;
            lVar61 = lVar61 + -1;
          } while (lVar61 != 0);
        }
        iVar49 = iVar48 + 1;
        lVar20 = local_2ff0;
      } while (iVar49 < iVar19);
    }
    auVar66 = _DAT_00674850;
    auVar65 = _DAT_00674840;
    auVar7 = _DAT_00674830;
    lVar61 = (long)(int)width;
    if (0 < (int)lVar20) {
      pqVar17 = bits + 2;
      lVar31 = 0;
      do {
        pvVar5 = ((void **)((long)QStack_1c40 + 0x10))[lVar31 * 7];
        uVar23 = (uint)((qsizetype *)((long)QStack_1c40 + 8))[lVar31 * 7];
        if ((int)uVar23 < 2) {
          uVar15 = 0;
        }
        else {
          uVar15 = 1;
          do {
            uVar3 = *(ushort *)((long)pvVar5 + uVar15 * 2);
            uVar59 = uVar15;
            do {
              uVar4 = *(ushort *)((long)pvVar5 + uVar59 * 2 + -2);
              if (uVar4 <= uVar3) goto LAB_0047b175;
              *(ushort *)((long)pvVar5 + uVar59 * 2) = uVar4;
              uVar59 = uVar59 - 1;
            } while (uVar59 != 0);
            uVar59 = 0;
LAB_0047b175:
            *(ushort *)((long)pvVar5 + (long)(int)uVar59 * 2) = uVar3;
            uVar15 = uVar15 + 1;
          } while (uVar15 != (uVar23 & 0x7fffffff));
          uVar59 = 0;
          do {
            uVar3 = *(ushort *)((long)pvVar5 + uVar59 * 2);
            uVar15 = (ulong)uVar3;
            uVar4 = *(ushort *)((long)pvVar5 + uVar59 * 2 + 2);
            if (uVar3 < uVar4) {
              lVar20 = uVar4 - uVar15;
              lVar47 = lVar20 + -1;
              auVar70._8_4_ = (int)lVar47;
              auVar70._0_8_ = lVar47;
              auVar70._12_4_ = (int)((ulong)lVar47 >> 0x20);
              uVar53 = 0;
              do {
                auVar68._8_4_ = (int)uVar53;
                auVar68._0_8_ = uVar53;
                auVar68._12_4_ = (int)(uVar53 >> 0x20);
                auVar63 = (auVar68 | auVar65) ^ auVar66;
                iVar19 = SUB164(auVar70 ^ auVar66,0);
                bVar10 = iVar19 < auVar63._0_4_;
                iVar25 = SUB164(auVar70 ^ auVar66,4);
                iVar49 = auVar63._4_4_;
                if ((bool)(~(iVar25 < iVar49 || iVar49 == iVar25 && bVar10) & 1)) {
                  pqVar17[uVar15 + (uVar53 - 2)] = -0x7f80;
                }
                if (iVar25 >= iVar49 && (iVar49 != iVar25 || !bVar10)) {
                  pqVar17[uVar15 + (uVar53 - 1)] = -0x7f80;
                }
                auVar63 = (auVar68 | auVar7) ^ auVar66;
                iVar49 = auVar63._4_4_;
                if (iVar49 <= iVar25 && (iVar49 != iVar25 || auVar63._0_4_ <= iVar19)) {
                  pqVar17[uVar15 + uVar53] = -0x7f80;
                  pqVar17[uVar15 + uVar53 + 1] = -0x7f80;
                }
                uVar53 = uVar53 + 4;
              } while ((lVar20 + 3U & 0xfffffffffffffffc) != uVar53);
            }
            uVar15 = uVar59 + 2;
            uVar53 = uVar59 + 3;
            uVar59 = uVar15;
            lVar20 = local_2ff0;
          } while (uVar53 < (uVar23 & 0x7fffffff));
        }
        lVar47 = lVar31 * lVar61;
        if (((int)uVar15 < (int)uVar23) &&
           (uVar3 = *(ushort *)((long)pvVar5 + (uVar15 & 0xffffffff) * 2), uVar15 = (ulong)uVar3,
           (int)(uint)uVar3 < (int)width)) {
          lVar43 = width - uVar15;
          lVar44 = lVar43 + -1;
          auVar67._8_4_ = (int)lVar44;
          auVar67._0_8_ = lVar44;
          auVar67._12_4_ = (int)((ulong)lVar44 >> 0x20);
          uVar59 = 0;
          do {
            auVar69._8_4_ = (int)uVar59;
            auVar69._0_8_ = uVar59;
            auVar69._12_4_ = (int)(uVar59 >> 0x20);
            auVar63 = (auVar69 | auVar65) ^ auVar66;
            iVar19 = SUB164(auVar67 ^ auVar66,0);
            bVar10 = iVar19 < auVar63._0_4_;
            iVar25 = SUB164(auVar67 ^ auVar66,4);
            iVar49 = auVar63._4_4_;
            if ((bool)(~(iVar25 < iVar49 || iVar49 == iVar25 && bVar10) & 1)) {
              bits[lVar47 + uVar15 + uVar59] = -0x7f80;
            }
            if (iVar25 >= iVar49 && (iVar49 != iVar25 || !bVar10)) {
              bits[lVar47 + uVar15 + uVar59 + 1] = -0x7f80;
            }
            auVar63 = (auVar69 | auVar7) ^ auVar66;
            iVar49 = auVar63._4_4_;
            if (iVar49 <= iVar25 && (iVar49 != iVar25 || auVar63._0_4_ <= iVar19)) {
              bits[lVar47 + uVar15 + uVar59 + 2] = -0x7f80;
              bits[lVar47 + uVar15 + uVar59 + 3] = -0x7f80;
            }
            uVar59 = uVar59 + 4;
          } while ((lVar43 + 3U & 0xfffffffffffffffc) != uVar59);
        }
        lVar31 = lVar31 + 1;
        pqVar17 = pqVar17 + lVar61;
      } while (lVar31 != lVar20);
    }
    std::_Destroy_n_aux<false>::__destroy_n<QVarLengthArray<unsigned_short,16ll>*,long_long>
              ((QVarLengthArray<unsigned_short,_16LL> *)QStack_1c40,
               CONCAT44(uStack_1c44,iStack_1c48));
    if (QStack_1c40 != (QPoint)local_1c38) {
      QtPrivate::sizedFree((void *)QStack_1c40,CONCAT44(local_1c50._4_4_,local_1c50._0_4_) * 0x38);
    }
    if (0 < local_2f28.siz) {
      local_2f70 = (double)(iVar57 << 0x10);
      local_2fc0 = iVar57 << 8;
      local_2f8c = (width - iVar57) * 0x100;
      local_2f90 = ((int)local_2ff0 - iVar57) * 0x100;
      local_2fd0 = bits + -1;
      iVar19 = 0;
      do {
        local_24b8.super_QVLABaseBase.s = 0;
        local_2cd0.super_QVLABaseBase.s = 0;
        local_2f00.super_QVLABaseBase.s = 0;
        local_2f94 = -iVar19;
        lVar20 = (long)iVar19 + -2;
        iVar57 = 0;
        do {
          iVar25 = iVar57;
          local_2f94 = local_2f94 - 1;
          lVar31 = lVar20 + 2;
          lVar20 = lVar20 + 1;
          iVar57 = iVar25 + 1;
        } while (local_2fb0[lVar31] != 0xffffffff);
        lVar31 = (long)iVar19;
        puVar33 = local_2fb0;
        if (iVar19 < (int)~local_2f94) {
          do {
            lVar47 = lVar31;
            pQVar8 = local_2f48.buffer;
            uVar23 = puVar33[lVar47];
            local_2f08 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            iVar19 = local_2f48.buffer[uVar23].xp.m_i;
            iVar57 = local_2f48.buffer[puVar33[(int)lVar20]].xp.m_i;
            iVar49 = local_2f48.buffer[uVar23].yp.m_i -
                     local_2f48.buffer[puVar33[(int)lVar20]].yp.m_i;
            if ((iVar49 != 0) || (iVar57 != iVar19)) {
              iVar57 = iVar57 - iVar19;
              dVar64 = (double)iVar57;
              dVar64 = local_2f70 / SQRT((double)iVar49 * (double)iVar49 + dVar64 * dVar64);
              iVar19 = (int)((double)((ulong)dVar64 & 0x8000000000000000 | (ulong)DAT_00674780) +
                            dVar64);
              local_2f08.xp.m_i = iVar49 * iVar19 >> 8;
              local_2f08.yp.m_i = iVar57 * iVar19 >> 8;
              if (local_24b8.super_QVLABaseBase.s == local_24b8.super_QVLABaseBase.a) {
                local_1c50._0_4_ = local_2f08.xp.m_i;
                local_1c50._4_4_ = local_2f08.yp.m_i;
                QVLABase<QPoint>::emplace_back_impl<QPoint>
                          (&local_24b8,0x100,local_24a0,(QPoint *)local_1c50);
              }
              else {
                QVLABase<QPoint>::emplace_back_impl<QPoint_const&>
                          (&local_24b8,0x100,local_24a0,&local_2f08);
              }
              local_2f50.xp.m_i = pQVar8[uVar23].xp.m_i + 0x7f;
              local_2f50.yp.m_i = pQVar8[uVar23].yp.m_i + 0x7f;
              if (local_2cd0.super_QVLABaseBase.s == local_2cd0.super_QVLABaseBase.a) {
                local_1c50._0_4_ = local_2f50.xp.m_i;
                local_1c50._4_4_ = local_2f50.yp.m_i;
                QVLABase<QPoint>::emplace_back_impl<QPoint>
                          (&local_2cd0,0x100,local_2cb8,(QPoint *)local_1c50);
              }
              else {
                QVLABase<QPoint>::emplace_back_impl<QPoint_const&>
                          (&local_2cd0,0x100,local_2cb8,&local_2f50);
              }
              iVar19 = pQVar8[uVar23].xp.m_i;
              bVar10 = true;
              if (((local_2fc0 <= iVar19) && (iVar19 < local_2f8c)) &&
                 (iVar19 = pQVar8[uVar23].yp.m_i, local_2fc0 <= iVar19)) {
                bVar10 = local_2f90 <= iVar19;
              }
              local_1c50[0] = bVar10;
              QVLABase<bool>::emplace_back_impl<bool>
                        (&local_2f00,0x100,local_2ee8,(bool *)local_1c50);
              puVar33 = local_2fb0;
            }
            iVar25 = iVar25 + -1;
            lVar31 = lVar47 + 1;
            lVar20 = lVar47;
          } while (iVar25 != 0);
        }
        qVar9 = local_24b8.super_QVLABaseBase.s;
        pQVar34 = (QArrayData *)local_2de8.super_QVLABaseBase.a;
        if (local_2de8.super_QVLABaseBase.a <= local_24b8.super_QVLABaseBase.s) {
          pQVar34 = (QArrayData *)local_24b8.super_QVLABaseBase.s;
        }
        QVLABase<bool>::reallocate_impl
                  (&local_2de8,0x100,local_2dd0,local_24b8.super_QVLABaseBase.s,(qsizetype)pQVar34);
        local_2de8.super_QVLABaseBase.s = qVar9;
        if (0 < local_24b8.super_QVLABaseBase.s) {
          iVar57 = (int)local_24b8.super_QVLABaseBase.s + -1;
          pQVar34 = (QArrayData *)0x0;
          iVar19 = iVar57;
          do {
            lVar20 = (long)iVar19;
            *(bool *)((long)local_2de8.super_QVLABaseBase.ptr + lVar20) =
                 *(int *)((long)local_24b8.super_QVLABaseBase.ptr + (long)pQVar34 * 8 + 4) *
                 *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar20 * 8) <
                 *(int *)((long)local_24b8.super_QVLABaseBase.ptr + (long)pQVar34 * 8) *
                 *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar20 * 8 + 4);
            iVar19 = (int)pQVar34;
            pQVar34 = (QArrayData *)
                      ((long)&(pQVar34->ref_)._q_value.super___atomic_base<int>._M_i + 1);
          } while ((QArrayData *)local_24b8.super_QVLABaseBase.s != pQVar34);
          lVar20 = 0;
          do {
            local_3020 = &local_2f08;
            local_2f60 = *(ulong *)((long)local_24b8.super_QVLABaseBase.ptr + lVar20 * 8);
            lVar31 = (long)iVar57;
            local_3018 = (Representation *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8);
            local_3048 = (int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar20 * 8);
            uVar23 = local_3048[1];
            iVar19 = (int)*(undefined8 *)local_3018;
            iVar57 = (int)local_2f60;
            local_309c = iVar19 - iVar57;
            local_3070 = (uint)((ulong)*(undefined8 *)local_3018 >> 0x20);
            iVar25 = (int)(local_2f60 >> 0x20);
            local_2f08.yp.m_i = local_3070 - iVar25;
            local_2f08.xp.m_i = local_309c;
            local_1c50._0_4_ = iVar19 + iVar57;
            local_1c50._4_4_ = local_3070 + iVar25;
            local_3000.yp.m_i = *local_3048 - iVar57;
            uVar39 = uVar23 - iVar25;
            local_3000.xp.m_i = uVar39;
            local_2fbc._0_4_ = *local_3048 + iVar57;
            local_30b4 = uVar23 + iVar25;
            local_2fd4.m_i = local_30b4;
            cVar2 = *(char *)((long)local_2f00.super_QVLABaseBase.ptr + lVar31);
            local_2fa0 = lVar20;
            local_2f80 = (undefined1 *)local_24b8.super_QVLABaseBase.ptr;
            local_2f68 = local_2f60 >> 0x20;
            iVar19 = (int)local_2ff0;
            if ((cVar2 == '\0') &&
               (*(char *)((long)local_2f00.super_QVLABaseBase.ptr + lVar20) != '\x01')) {
              local_3080 = 0x7f80;
              if ((int)uVar23 < (int)local_3070) {
                local_3080 = -0x7f80;
                local_2fc8 = &local_3000;
                local_2fa8 = &local_3000.yp;
                local_3040 = &local_2fd4;
                local_3020 = (QPoint *)local_2fbc;
                local_2f78 = &local_2f08.yp;
                local_2fbc._4_8_ = (QPoint *)(local_1c50 + 4);
                local_2f88 = (Representation *)local_1c50;
                piVar27 = (int *)local_3018;
                uVar40 = uVar39;
                uVar39 = local_1c50._4_4_;
                RVar45.m_i = local_30b4;
                local_30b4 = local_2f08.yp.m_i;
                local_309c = local_2fbc._0_4_;
                local_3018 = (Representation *)local_3048;
                uVar51 = local_3070;
                local_3070 = uVar23;
              }
              else {
                local_2fc8 = (QPoint *)(local_1c50 + 4);
                local_2fa8 = (Representation *)local_1c50;
                local_3040 = &local_2f08.yp;
                local_2f78 = &local_2fd4;
                local_2fbc._4_8_ = &local_3000;
                local_2f88 = &local_3000.yp;
                piVar27 = local_3048;
                uVar40 = local_1c50._4_4_;
                RVar45.m_i = local_2f08.yp.m_i;
                uVar51 = uVar23;
              }
              iVar48 = 0;
              local_3064 = 0;
              iVar49 = 0;
              iVar35 = RVar45.m_i - uVar40;
              if (iVar35 != 0) {
                iVar49 = ((local_309c - local_2fa8->m_i) * 0x100) / iVar35;
                local_3064 = (local_3080 << 9) / iVar35;
              }
              iVar24 = local_2f88->m_i;
              iVar41 = RVar45.m_i - uVar39;
              if (iVar41 != 0) {
                iVar48 = ((local_309c - iVar24) * 0x100) / iVar41;
              }
              iVar46 = local_2fa8->m_i;
              iVar11 = local_309c - iVar46;
              local_2fe0 = (Representation *)CONCAT44(local_2fe0._4_4_,iVar46);
              iVar42 = (iVar46 - iVar24) * iVar35 + (uVar39 - uVar40) * iVar11;
              if (iVar42 == 0) {
                iVar42 = 0;
              }
              else {
                iVar42 = (int)(((long)(int)((uVar39 - RVar45.m_i) * local_3080) << 9) / (long)iVar42
                              );
              }
              iVar14 = (int)local_3070 >> 8;
              iVar36 = (int)uVar51 >> 8;
              iVar37 = (int)uVar40 >> 8;
              iVar29 = (int)local_30b4 >> 8;
              iVar21 = RVar45.m_i >> 8;
              iVar26 = (int)uVar39 >> 8;
              uVar38 = ~local_3070 & 0xff;
              uVar23 = ~uVar51 & 0xff;
              uVar52 = ~uVar40 & 0xff;
              uVar51 = ~RVar45.m_i & 0xff;
              iVar12 = *piVar27;
              iVar60 = local_3018->m_i;
              local_2ff8 = local_3020;
              if (iVar12 < iVar60) {
                if ((int)uVar40 < (int)uVar39) {
                  uVar39 = (int)(uVar51 * (local_309c - iVar24)) / iVar41 + local_309c;
                  if (iVar21 != iVar37) {
                    iVar11 = iVar60 + (iVar21 - iVar14) * iVar49 + (int)(iVar11 * uVar38) / iVar35;
                    iVar35 = iVar37 - iVar21;
                    pqVar17 = bits + (int)(iVar21 * width);
                    do {
                      if ((int)uVar39 >> 8 < iVar11 >> 8) {
                        uVar51 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) + local_3080;
                        lVar20 = (long)((int)uVar39 >> 8);
                        do {
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          uVar38 = pqVar17[lVar20];
                          uVar55 = -uVar38;
                          if (0 < (int)uVar38) {
                            uVar55 = uVar38;
                          }
                          if (uVar40 < uVar55) {
                            uVar38 = uVar51;
                          }
                          pqVar17[lVar20] = uVar38;
                          uVar51 = uVar51 + iVar42;
                          lVar20 = lVar20 + 1;
                        } while (iVar11 >> 8 != (int)lVar20);
                      }
                      uVar39 = uVar39 + iVar48;
                      iVar11 = iVar11 + iVar49;
                      pqVar17 = pqVar17 + lVar61;
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                  }
                  uVar51 = (int)((local_309c - iVar24) * uVar52) / iVar41 + iVar46;
                  if (iVar37 != iVar26) {
                    pqVar17 = bits + (int)(iVar37 * width);
                    iVar35 = iVar26 - iVar37;
                    uVar40 = uVar51;
                    do {
                      if ((int)uVar39 >> 8 < (int)uVar40 >> 8) {
                        uVar38 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) + local_3080;
                        lVar20 = (long)((int)uVar39 >> 8);
                        do {
                          uVar52 = -uVar38;
                          if (0 < (int)uVar38) {
                            uVar52 = uVar38;
                          }
                          uVar55 = pqVar17[lVar20];
                          uVar56 = -uVar55;
                          if (0 < (int)uVar55) {
                            uVar56 = uVar55;
                          }
                          if (uVar52 < uVar56) {
                            uVar55 = uVar38;
                          }
                          pqVar17[lVar20] = uVar55;
                          uVar38 = uVar38 + iVar42;
                          lVar20 = lVar20 + 1;
                        } while ((int)uVar40 >> 8 != (int)lVar20);
                      }
                      uVar39 = uVar39 + iVar48;
                      uVar40 = uVar40 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                    uVar51 = uVar51 + (iVar26 - iVar37) * iVar48;
                  }
                  if (iVar26 != iVar29) {
                    iVar35 = (iVar26 - iVar36) * iVar49 + *piVar27 +
                             (int)(((local_3020->xp).m_i - local_2fa8->m_i) * uVar23) /
                             (local_3040->m_i - (local_2fc8->xp).m_i);
                    iVar29 = iVar29 - iVar26;
                    pqVar17 = bits + (int)(iVar26 * width);
                    do {
                      if (iVar35 >> 8 < (int)uVar51 >> 8) {
                        uVar23 = ((int)((~uVar51 & 0xff) * iVar42) >> 8) - (local_3080 + iVar42);
                        lVar20 = (long)((int)uVar51 >> 8);
                        do {
                          uVar39 = -uVar23;
                          if (0 < (int)uVar23) {
                            uVar39 = uVar23;
                          }
                          uVar40 = pqVar17[lVar20 + -1];
                          uVar38 = -uVar40;
                          if (0 < (int)uVar40) {
                            uVar38 = uVar40;
                          }
                          if (uVar39 < uVar38) {
                            uVar40 = uVar23;
                          }
                          pqVar17[lVar20 + -1] = uVar40;
                          lVar20 = lVar20 + -1;
                          uVar23 = uVar23 - iVar42;
                        } while (iVar35 >> 8 != (int)lVar20);
                      }
                      iVar35 = iVar35 + iVar49;
                      uVar51 = uVar51 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                }
                else {
                  iVar60 = iVar60 + (iVar21 - iVar14) * iVar49 + (int)(uVar38 * iVar11) / iVar35;
                  iVar46 = iVar26 - iVar21;
                  if (iVar46 != 0) {
                    uVar39 = (int)((local_309c - iVar24) * uVar51) / iVar41 + local_309c;
                    pqVar17 = bits + (int)(iVar21 * width);
                    do {
                      if ((int)uVar39 >> 8 < iVar60 >> 8) {
                        uVar51 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) + local_3080;
                        lVar20 = (long)((int)uVar39 >> 8);
                        do {
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          uVar38 = pqVar17[lVar20];
                          uVar55 = -uVar38;
                          if (0 < (int)uVar38) {
                            uVar55 = uVar38;
                          }
                          if (uVar40 < uVar55) {
                            uVar38 = uVar51;
                          }
                          pqVar17[lVar20] = uVar38;
                          uVar51 = uVar51 + iVar42;
                          lVar20 = lVar20 + 1;
                        } while (iVar60 >> 8 != (int)lVar20);
                      }
                      uVar39 = uVar39 + iVar48;
                      iVar60 = iVar60 + iVar49;
                      pqVar17 = pqVar17 + lVar61;
                      iVar46 = iVar46 + -1;
                    } while (iVar46 != 0);
                  }
                  uVar23 = iVar12 + (iVar26 - iVar36) * iVar49 + (int)(uVar23 * iVar11) / iVar35;
                  if (iVar26 != iVar37) {
                    uVar15 = (long)(int)(((((Representation *)local_2fbc._4_8_)->m_i | 0xffU) -
                                         piVar27[1]) * local_3080 * 2) /
                             (long)(local_3040->m_i - (local_2fc8->xp).m_i) & 0xffffffff;
                    iVar35 = iVar37 - iVar26;
                    pqVar17 = bits + (int)(iVar26 * width);
                    do {
                      if ((int)uVar23 >> 8 < iVar60 >> 8) {
                        uVar39 = ((int)((~uVar23 & 0xff) * iVar42) >> 8) + (int)uVar15;
                        lVar20 = (long)((int)uVar23 >> 8);
                        do {
                          uVar51 = -uVar39;
                          if (0 < (int)uVar39) {
                            uVar51 = uVar39;
                          }
                          uVar40 = pqVar17[lVar20];
                          uVar38 = -uVar40;
                          if (0 < (int)uVar40) {
                            uVar38 = uVar40;
                          }
                          if (uVar51 < uVar38) {
                            uVar40 = uVar39;
                          }
                          pqVar17[lVar20] = uVar40;
                          uVar39 = uVar39 + iVar42;
                          lVar20 = lVar20 + 1;
                        } while (iVar60 >> 8 != (int)lVar20);
                      }
                      uVar23 = uVar23 + iVar49;
                      uVar15 = (ulong)(uint)((int)uVar15 + local_3064);
                      iVar60 = iVar60 + iVar49;
                      pqVar17 = pqVar17 + lVar61;
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                  }
                  iVar29 = iVar29 - iVar37;
                  if (iVar29 != 0) {
                    uVar39 = (int)(((local_3020->xp).m_i - local_2f88->m_i) * uVar52) /
                             (local_3040->m_i - ((Representation *)local_2fbc._4_8_)->m_i) +
                             local_2fa8->m_i;
                    pqVar17 = bits + (int)(iVar37 * width);
                    do {
                      if ((int)uVar23 >> 8 < (int)uVar39 >> 8) {
                        uVar51 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) - (local_3080 + iVar42);
                        lVar20 = (long)((int)uVar39 >> 8);
                        do {
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          uVar38 = pqVar17[lVar20 + -1];
                          uVar52 = -uVar38;
                          if (0 < (int)uVar38) {
                            uVar52 = uVar38;
                          }
                          if (uVar40 < uVar52) {
                            uVar38 = uVar51;
                          }
                          pqVar17[lVar20 + -1] = uVar38;
                          lVar20 = lVar20 + -1;
                          uVar51 = uVar51 - iVar42;
                        } while ((int)uVar23 >> 8 != (int)lVar20);
                      }
                      uVar23 = uVar23 + iVar49;
                      uVar39 = uVar39 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                  }
                }
              }
              else if (RVar45.m_i < (int)local_30b4) {
                uVar39 = (int)((local_309c - iVar24) * uVar52) / iVar41 + iVar46;
                if (iVar37 != iVar21) {
                  iVar46 = iVar60 + (iVar37 - iVar14) * iVar49 + (int)(iVar11 * uVar38) / iVar35;
                  iVar35 = iVar21 - iVar37;
                  pqVar17 = bits + (int)(iVar37 * width);
                  do {
                    if (iVar46 >> 8 < (int)uVar39 >> 8) {
                      uVar40 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) - (local_3080 + iVar42);
                      lVar20 = (long)((int)uVar39 >> 8);
                      do {
                        uVar38 = -uVar40;
                        if (0 < (int)uVar40) {
                          uVar38 = uVar40;
                        }
                        uVar52 = pqVar17[lVar20 + -1];
                        uVar55 = -uVar52;
                        if (0 < (int)uVar52) {
                          uVar55 = uVar52;
                        }
                        if (uVar38 < uVar55) {
                          uVar52 = uVar40;
                        }
                        pqVar17[lVar20 + -1] = uVar52;
                        lVar20 = lVar20 + -1;
                        uVar40 = uVar40 - iVar42;
                      } while (iVar46 >> 8 != (int)lVar20);
                    }
                    iVar46 = iVar46 + iVar49;
                    uVar39 = uVar39 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar35 = iVar35 + -1;
                  } while (iVar35 != 0);
                }
                uVar51 = (int)(uVar51 * (local_309c - iVar24)) / iVar41 + local_309c;
                if (iVar21 != iVar29) {
                  pqVar17 = bits + (int)(iVar21 * width);
                  iVar35 = iVar29 - iVar21;
                  uVar40 = uVar51;
                  do {
                    if ((int)uVar40 >> 8 < (int)uVar39 >> 8) {
                      uVar38 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) - (local_3080 + iVar42);
                      lVar20 = (long)((int)uVar39 >> 8);
                      do {
                        uVar52 = -uVar38;
                        if (0 < (int)uVar38) {
                          uVar52 = uVar38;
                        }
                        uVar55 = pqVar17[lVar20 + -1];
                        uVar56 = -uVar55;
                        if (0 < (int)uVar55) {
                          uVar56 = uVar55;
                        }
                        if (uVar52 < uVar56) {
                          uVar55 = uVar38;
                        }
                        pqVar17[lVar20 + -1] = uVar55;
                        lVar20 = lVar20 + -1;
                        uVar38 = uVar38 - iVar42;
                      } while ((int)uVar40 >> 8 != (int)lVar20);
                    }
                    uVar40 = uVar40 + iVar48;
                    uVar39 = uVar39 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar35 = iVar35 + -1;
                  } while (iVar35 != 0);
                  uVar51 = uVar51 + (iVar29 - iVar21) * iVar48;
                }
                if (iVar29 != iVar26) {
                  iVar35 = (iVar29 - iVar36) * iVar49 + *piVar27 +
                           (int)(((local_3020->xp).m_i - local_2fa8->m_i) * uVar23) /
                           (local_3040->m_i - (local_2fc8->xp).m_i);
                  iVar26 = iVar26 - iVar29;
                  pqVar17 = bits + (int)(iVar29 * width);
                  do {
                    if ((int)uVar51 >> 8 < iVar35 >> 8) {
                      uVar23 = ((int)((~uVar51 & 0xff) * iVar42) >> 8) + local_3080;
                      lVar20 = (long)((int)uVar51 >> 8);
                      do {
                        uVar39 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar39 = uVar23;
                        }
                        uVar40 = pqVar17[lVar20];
                        uVar38 = -uVar40;
                        if (0 < (int)uVar40) {
                          uVar38 = uVar40;
                        }
                        if (uVar39 < uVar38) {
                          uVar40 = uVar23;
                        }
                        pqVar17[lVar20] = uVar40;
                        uVar23 = uVar23 + iVar42;
                        lVar20 = lVar20 + 1;
                      } while (iVar35 >> 8 != (int)lVar20);
                    }
                    uVar51 = uVar51 + iVar48;
                    iVar35 = iVar35 + iVar49;
                    pqVar17 = pqVar17 + lVar61;
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                }
              }
              else {
                iVar14 = iVar60 + (iVar37 - iVar14) * iVar49 + (int)(uVar38 * iVar11) / iVar35;
                iVar60 = iVar29 - iVar37;
                if (iVar60 != 0) {
                  uVar39 = (int)((local_309c - iVar24) * uVar52) / iVar41 + iVar46;
                  pqVar17 = bits + (int)(iVar37 * width);
                  do {
                    if (iVar14 >> 8 < (int)uVar39 >> 8) {
                      uVar40 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) - (local_3080 + iVar42);
                      lVar20 = (long)((int)uVar39 >> 8);
                      do {
                        uVar38 = -uVar40;
                        if (0 < (int)uVar40) {
                          uVar38 = uVar40;
                        }
                        uVar52 = pqVar17[lVar20 + -1];
                        uVar55 = -uVar52;
                        if (0 < (int)uVar52) {
                          uVar55 = uVar52;
                        }
                        if (uVar38 < uVar55) {
                          uVar52 = uVar40;
                        }
                        pqVar17[lVar20 + -1] = uVar52;
                        lVar20 = lVar20 + -1;
                        uVar40 = uVar40 - iVar42;
                      } while (iVar14 >> 8 != (int)lVar20);
                    }
                    iVar14 = iVar14 + iVar49;
                    uVar39 = uVar39 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar60 = iVar60 + -1;
                  } while (iVar60 != 0);
                }
                uVar23 = iVar12 + (iVar29 - iVar36) * iVar49 + (int)(uVar23 * iVar11) / iVar35;
                if (iVar29 != iVar21) {
                  iVar24 = iVar21 - iVar29;
                  pqVar17 = bits + (int)(iVar29 * width);
                  iVar35 = (int)(((local_2f78->m_i | 0xffU) - piVar27[1]) * local_3080 * 2) /
                           (local_3040->m_i - (local_2fc8->xp).m_i) - iVar42;
                  do {
                    if (iVar14 >> 8 < (int)uVar23 >> 8) {
                      lVar20 = (long)((int)uVar23 >> 8);
                      uVar39 = ((int)((~uVar23 & 0xff) * iVar42) >> 8) + iVar35;
                      do {
                        uVar40 = -uVar39;
                        if (0 < (int)uVar39) {
                          uVar40 = uVar39;
                        }
                        uVar38 = pqVar17[lVar20 + -1];
                        uVar52 = -uVar38;
                        if (0 < (int)uVar38) {
                          uVar52 = uVar38;
                        }
                        if (uVar40 < uVar52) {
                          uVar38 = uVar39;
                        }
                        pqVar17[lVar20 + -1] = uVar38;
                        lVar20 = lVar20 + -1;
                        uVar39 = uVar39 - iVar42;
                      } while (iVar14 >> 8 != (int)lVar20);
                    }
                    iVar14 = iVar14 + iVar49;
                    uVar23 = uVar23 + iVar49;
                    pqVar17 = pqVar17 + lVar61;
                    iVar35 = iVar35 + local_3064;
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                }
                iVar26 = iVar26 - iVar21;
                if (iVar26 != 0) {
                  iVar35 = (local_3020->xp).m_i;
                  uVar39 = (int)((iVar35 - local_2f88->m_i) * uVar51) /
                           (local_3040->m_i - ((Representation *)local_2fbc._4_8_)->m_i) + iVar35;
                  pqVar17 = bits + (int)(iVar21 * width);
                  do {
                    if ((int)uVar39 >> 8 < (int)uVar23 >> 8) {
                      uVar51 = ((int)((~uVar39 & 0xff) * iVar42) >> 8) + local_3080;
                      lVar20 = (long)((int)uVar39 >> 8);
                      do {
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        uVar38 = pqVar17[lVar20];
                        uVar52 = -uVar38;
                        if (0 < (int)uVar38) {
                          uVar52 = uVar38;
                        }
                        if (uVar40 < uVar52) {
                          uVar38 = uVar51;
                        }
                        pqVar17[lVar20] = uVar38;
                        uVar51 = uVar51 + iVar42;
                        lVar20 = lVar20 + 1;
                      } while ((int)uVar23 >> 8 != (int)lVar20);
                    }
                    uVar39 = uVar39 + iVar48;
                    uVar23 = uVar23 + iVar49;
                    pqVar17 = pqVar17 + lVar61;
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                }
              }
            }
            else {
              local_3098 = 0x7f80;
              if ((int)uVar23 < (int)local_3070) {
                local_3098 = -0x7f80;
                local_2ff8 = (QPoint *)(local_1c50 + 4);
                local_3038 = (Representation *)local_1c50;
                local_3020 = (QPoint *)local_2fbc;
                local_3028 = &local_3000;
                local_2fe0 = &local_3000.yp;
                uVar51 = uVar39;
                local_309c = local_2fbc._0_4_;
                uVar39 = local_1c50._4_4_;
                RVar45.m_i = local_30b4;
                local_30b4 = local_2f08.yp.m_i;
                uVar40 = uVar23;
                uVar23 = local_3070;
                local_3050 = local_3048;
                local_3048 = (int *)local_3018;
                local_3018 = &local_2fd4;
              }
              else {
                local_2ff8 = &local_3000;
                local_3038 = &local_3000.yp;
                local_3028 = (QPoint *)(local_1c50 + 4);
                local_2fe0 = (Representation *)local_1c50;
                uVar51 = local_1c50._4_4_;
                RVar45.m_i = local_2f08.yp.m_i;
                uVar40 = local_3070;
                local_3050 = (int *)local_3018;
                local_3018 = &local_2f08.yp;
              }
              iVar49 = (int)uVar40 >> 8;
              if (iVar19 < (int)uVar40 >> 8) {
                iVar49 = iVar19;
              }
              iVar48 = 0;
              if (iVar49 < 1) {
                iVar49 = iVar48;
              }
              iVar35 = (int)uVar23 >> 8;
              if (iVar19 < (int)uVar23 >> 8) {
                iVar35 = iVar19;
              }
              if (iVar35 < 1) {
                iVar35 = iVar48;
              }
              iVar24 = (int)uVar51 >> 8;
              if (iVar19 < (int)uVar51 >> 8) {
                iVar24 = iVar19;
              }
              if (iVar24 < 1) {
                iVar24 = iVar48;
              }
              iVar41 = (int)local_30b4 >> 8;
              if (iVar19 < (int)local_30b4 >> 8) {
                iVar41 = iVar19;
              }
              if (iVar41 < 1) {
                iVar41 = iVar48;
              }
              iVar46 = RVar45.m_i >> 8;
              if (iVar19 < RVar45.m_i >> 8) {
                iVar46 = iVar19;
              }
              if (iVar46 < 1) {
                iVar46 = iVar48;
              }
              iVar42 = (int)uVar39 >> 8;
              if (iVar19 < (int)uVar39 >> 8) {
                iVar42 = iVar19;
              }
              if (iVar42 < 1) {
                iVar42 = iVar48;
              }
              iVar12 = 0;
              iVar11 = 0;
              iVar60 = RVar45.m_i - uVar51;
              if (iVar60 != 0) {
                iVar11 = ((local_309c - local_2fe0->m_i) * 0x100) / iVar60;
                iVar12 = (local_3098 << 9) / iVar60;
              }
              iVar14 = local_3038->m_i;
              iVar36 = RVar45.m_i - uVar39;
              if (iVar36 != 0) {
                iVar48 = ((local_309c - iVar14) * 0x100) / iVar36;
              }
              iVar37 = local_2fe0->m_i;
              iVar26 = local_309c - iVar37;
              iVar21 = (iVar37 - iVar14) * iVar60 + (uVar39 - uVar51) * iVar26;
              if (iVar21 == 0) {
                iVar21 = 0;
              }
              else {
                iVar21 = (int)(((long)(int)((uVar39 - RVar45.m_i) * local_3098) << 9) / (long)iVar21
                              );
              }
              iVar54 = (iVar49 * 0x100 - uVar40) + 0xff;
              iVar28 = (iVar35 * 0x100 - uVar23) + 0xff;
              iVar22 = (iVar24 * 0x100 - uVar51) + 0xff;
              iVar13 = (iVar46 * 0x100 - RVar45.m_i) + 0xff;
              iVar29 = *local_3048;
              iVar50 = *local_3050;
              if (iVar29 < iVar50) {
                if ((int)uVar51 < (int)uVar39) {
                  iVar12 = (iVar13 * (local_309c - iVar14)) / iVar36 + local_309c;
                  if (iVar46 != iVar24) {
                    iVar60 = iVar50 + (iVar46 - iVar49) * iVar11 + (iVar26 * iVar54) / iVar60;
                    iVar49 = iVar24 - iVar46;
                    pqVar17 = bits + (int)(iVar46 * width);
                    do {
                      uVar23 = iVar12 >> 8;
                      if (iVar12 >> 8 < 1) {
                        uVar23 = 0;
                      }
                      uVar51 = iVar60 >> 8;
                      uVar39 = width;
                      if ((int)uVar51 < (int)width) {
                        uVar39 = uVar51;
                      }
                      if ((int)uVar23 < (int)uVar39) {
                        uVar15 = (ulong)uVar23;
                        uVar23 = ((int)(((uVar23 * 0x100 - iVar12) + 0xff) * iVar21) >> 8) +
                                 local_3098;
                        lVar20 = (long)(int)uVar51;
                        if (lVar61 < (int)uVar51) {
                          lVar20 = lVar61;
                        }
                        do {
                          uVar39 = -uVar23;
                          if (0 < (int)uVar23) {
                            uVar39 = uVar23;
                          }
                          uVar51 = pqVar17[uVar15];
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar39 < uVar40) {
                            uVar51 = uVar23;
                          }
                          pqVar17[uVar15] = uVar51;
                          uVar23 = uVar23 + iVar21;
                          uVar15 = uVar15 + 1;
                        } while ((int)lVar20 != (int)uVar15);
                      }
                      iVar12 = iVar12 + iVar48;
                      iVar60 = iVar60 + iVar11;
                      pqVar17 = pqVar17 + lVar61;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                  }
                  iVar37 = ((local_309c - iVar14) * iVar22) / iVar36 + iVar37;
                  if (iVar24 != iVar42) {
                    pqVar17 = bits + (int)(iVar24 * width);
                    iVar49 = iVar42 - iVar24;
                    iVar46 = iVar37;
                    do {
                      uVar23 = iVar12 >> 8;
                      if (iVar12 >> 8 < 1) {
                        uVar23 = 0;
                      }
                      uVar51 = iVar46 >> 8;
                      uVar39 = width;
                      if ((int)uVar51 < (int)width) {
                        uVar39 = uVar51;
                      }
                      if ((int)uVar23 < (int)uVar39) {
                        uVar15 = (ulong)uVar23;
                        uVar23 = ((int)(((uVar23 * 0x100 - iVar12) + 0xff) * iVar21) >> 8) +
                                 local_3098;
                        lVar20 = (long)(int)uVar51;
                        if (lVar61 < (int)uVar51) {
                          lVar20 = lVar61;
                        }
                        do {
                          uVar39 = -uVar23;
                          if (0 < (int)uVar23) {
                            uVar39 = uVar23;
                          }
                          uVar51 = pqVar17[uVar15];
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar39 < uVar40) {
                            uVar51 = uVar23;
                          }
                          pqVar17[uVar15] = uVar51;
                          uVar23 = uVar23 + iVar21;
                          uVar15 = uVar15 + 1;
                        } while ((int)lVar20 != (int)uVar15);
                      }
                      iVar12 = iVar12 + iVar48;
                      iVar46 = iVar46 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                    iVar37 = iVar37 + (iVar42 - iVar24) * iVar48;
                  }
                  if (iVar42 != iVar41) {
                    iVar49 = (iVar42 - iVar35) * iVar11 + *local_3048 +
                             (((local_3020->xp).m_i - local_2fe0->m_i) * iVar28) /
                             (local_3018->m_i - (local_3028->xp).m_i);
                    iVar41 = iVar41 - iVar42;
                    pqVar17 = local_2fd0 + (int)(iVar42 * width);
                    do {
                      iVar35 = iVar49 >> 8;
                      if (iVar49 >> 8 < 1) {
                        iVar35 = 0;
                      }
                      uVar23 = iVar37 >> 8;
                      if ((int)width <= iVar37 >> 8) {
                        uVar23 = width;
                      }
                      if (iVar35 < (int)uVar23) {
                        uVar39 = ((int)(((uVar23 * 0x100 - iVar37) + 0xff) * iVar21) >> 8) -
                                 (local_3098 + iVar21);
                        puVar33 = (uint *)(pqVar17 + (int)uVar23);
                        iVar35 = iVar35 - uVar23;
                        do {
                          uVar23 = -uVar39;
                          if (0 < (int)uVar39) {
                            uVar23 = uVar39;
                          }
                          uVar51 = *puVar33;
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar23 < uVar40) {
                            uVar51 = uVar39;
                          }
                          *puVar33 = uVar51;
                          puVar33 = puVar33 + -1;
                          uVar39 = uVar39 - iVar21;
                          iVar35 = iVar35 + 1;
                        } while (iVar35 != 0);
                      }
                      iVar49 = iVar49 + iVar11;
                      iVar37 = iVar37 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                }
                else {
                  iVar37 = iVar50 + (iVar46 - iVar49) * iVar11 + (iVar54 * iVar26) / iVar60;
                  iVar49 = iVar42 - iVar46;
                  if (iVar49 != 0) {
                    iVar14 = ((local_309c - iVar14) * iVar13) / iVar36 + local_309c;
                    pqVar17 = bits + (int)(iVar46 * width);
                    do {
                      uVar23 = iVar14 >> 8;
                      if (iVar14 >> 8 < 1) {
                        uVar23 = 0;
                      }
                      uVar51 = iVar37 >> 8;
                      uVar39 = width;
                      if ((int)uVar51 < (int)width) {
                        uVar39 = uVar51;
                      }
                      if ((int)uVar23 < (int)uVar39) {
                        uVar15 = (ulong)uVar23;
                        uVar23 = ((int)(((uVar23 * 0x100 - iVar14) + 0xff) * iVar21) >> 8) +
                                 local_3098;
                        lVar20 = (long)(int)uVar51;
                        if (lVar61 < (int)uVar51) {
                          lVar20 = lVar61;
                        }
                        do {
                          uVar39 = -uVar23;
                          if (0 < (int)uVar23) {
                            uVar39 = uVar23;
                          }
                          uVar51 = pqVar17[uVar15];
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar39 < uVar40) {
                            uVar51 = uVar23;
                          }
                          pqVar17[uVar15] = uVar51;
                          uVar23 = uVar23 + iVar21;
                          uVar15 = uVar15 + 1;
                        } while ((int)lVar20 != (int)uVar15);
                      }
                      iVar14 = iVar14 + iVar48;
                      iVar37 = iVar37 + iVar11;
                      pqVar17 = pqVar17 + lVar61;
                      iVar49 = iVar49 + -1;
                    } while (iVar49 != 0);
                  }
                  iVar49 = iVar29 + (iVar42 - iVar35) * iVar11 + (iVar28 * iVar26) / iVar60;
                  if (iVar42 != iVar24) {
                    uVar15 = (long)(int)(((iVar42 << 8 | 0xffU) - local_3048[1]) * local_3098 * 2) /
                             (long)(local_3018->m_i - (local_3028->xp).m_i) & 0xffffffff;
                    iVar35 = iVar24 - iVar42;
                    pqVar17 = bits + (int)(iVar42 * width);
                    do {
                      uVar23 = iVar49 >> 8;
                      if (iVar49 >> 8 < 1) {
                        uVar23 = 0;
                      }
                      uVar51 = iVar37 >> 8;
                      uVar39 = width;
                      if ((int)uVar51 < (int)width) {
                        uVar39 = uVar51;
                      }
                      if ((int)uVar23 < (int)uVar39) {
                        uVar59 = (ulong)uVar23;
                        uVar23 = ((int)(((uVar23 * 0x100 - iVar49) + 0xff) * iVar21) >> 8) +
                                 (int)uVar15;
                        lVar20 = (long)(int)uVar51;
                        if (lVar61 < (int)uVar51) {
                          lVar20 = lVar61;
                        }
                        do {
                          uVar39 = -uVar23;
                          if (0 < (int)uVar23) {
                            uVar39 = uVar23;
                          }
                          uVar51 = pqVar17[uVar59];
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar39 < uVar40) {
                            uVar51 = uVar23;
                          }
                          pqVar17[uVar59] = uVar51;
                          uVar23 = uVar23 + iVar21;
                          uVar59 = uVar59 + 1;
                        } while ((int)lVar20 != (int)uVar59);
                      }
                      iVar49 = iVar49 + iVar11;
                      uVar15 = (ulong)(uint)((int)uVar15 + iVar12);
                      iVar37 = iVar37 + iVar11;
                      pqVar17 = pqVar17 + lVar61;
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                  }
                  iVar41 = iVar41 - iVar24;
                  if (iVar41 != 0) {
                    iVar35 = (((local_3020->xp).m_i - local_3038->m_i) * iVar22) /
                             (local_3018->m_i - (local_2ff8->xp).m_i) + local_2fe0->m_i;
                    pqVar17 = local_2fd0 + (int)(iVar24 * width);
                    do {
                      iVar24 = iVar49 >> 8;
                      if (iVar49 >> 8 < 1) {
                        iVar24 = 0;
                      }
                      uVar23 = iVar35 >> 8;
                      if ((int)width <= iVar35 >> 8) {
                        uVar23 = width;
                      }
                      if (iVar24 < (int)uVar23) {
                        uVar39 = ((int)(((uVar23 * 0x100 - iVar35) + 0xff) * iVar21) >> 8) -
                                 (local_3098 + iVar21);
                        puVar33 = (uint *)(pqVar17 + (int)uVar23);
                        iVar24 = iVar24 - uVar23;
                        do {
                          uVar23 = -uVar39;
                          if (0 < (int)uVar39) {
                            uVar23 = uVar39;
                          }
                          uVar51 = *puVar33;
                          uVar40 = -uVar51;
                          if (0 < (int)uVar51) {
                            uVar40 = uVar51;
                          }
                          if (uVar23 < uVar40) {
                            uVar51 = uVar39;
                          }
                          *puVar33 = uVar51;
                          puVar33 = puVar33 + -1;
                          uVar39 = uVar39 - iVar21;
                          iVar24 = iVar24 + 1;
                        } while (iVar24 != 0);
                      }
                      iVar49 = iVar49 + iVar11;
                      iVar35 = iVar35 + iVar48;
                      pqVar17 = pqVar17 + lVar61;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                }
              }
              else if (RVar45.m_i < (int)local_30b4) {
                iVar37 = ((local_309c - iVar14) * iVar22) / iVar36 + iVar37;
                if (iVar24 != iVar46) {
                  iVar12 = iVar50 + (iVar24 - iVar49) * iVar11 + (iVar26 * iVar54) / iVar60;
                  iVar49 = iVar46 - iVar24;
                  pqVar17 = local_2fd0 + (int)(iVar24 * width);
                  do {
                    iVar24 = iVar12 >> 8;
                    if (iVar24 < 1) {
                      iVar24 = 0;
                    }
                    uVar23 = iVar37 >> 8;
                    if ((int)width <= iVar37 >> 8) {
                      uVar23 = width;
                    }
                    if (iVar24 < (int)uVar23) {
                      uVar39 = ((int)(((uVar23 * 0x100 - iVar37) + 0xff) * iVar21) >> 8) -
                               (local_3098 + iVar21);
                      puVar33 = (uint *)(pqVar17 + (int)uVar23);
                      iVar24 = iVar24 - uVar23;
                      do {
                        uVar23 = -uVar39;
                        if (0 < (int)uVar39) {
                          uVar23 = uVar39;
                        }
                        uVar51 = *puVar33;
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar23 < uVar40) {
                          uVar51 = uVar39;
                        }
                        *puVar33 = uVar51;
                        puVar33 = puVar33 + -1;
                        uVar39 = uVar39 - iVar21;
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != 0);
                    }
                    iVar12 = iVar12 + iVar11;
                    iVar37 = iVar37 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                iVar49 = (iVar13 * (local_309c - iVar14)) / iVar36 + local_309c;
                if (iVar46 != iVar41) {
                  pqVar17 = local_2fd0 + (int)(iVar46 * width);
                  iVar24 = iVar41 - iVar46;
                  iVar12 = iVar49;
                  do {
                    iVar60 = iVar12 >> 8;
                    if (iVar12 >> 8 < 1) {
                      iVar60 = 0;
                    }
                    uVar23 = iVar37 >> 8;
                    if ((int)width <= iVar37 >> 8) {
                      uVar23 = width;
                    }
                    if (iVar60 < (int)uVar23) {
                      uVar39 = ((int)(((uVar23 * 0x100 - iVar37) + 0xff) * iVar21) >> 8) -
                               (local_3098 + iVar21);
                      puVar33 = (uint *)(pqVar17 + (int)uVar23);
                      iVar60 = iVar60 - uVar23;
                      do {
                        uVar23 = -uVar39;
                        if (0 < (int)uVar39) {
                          uVar23 = uVar39;
                        }
                        uVar51 = *puVar33;
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar23 < uVar40) {
                          uVar51 = uVar39;
                        }
                        *puVar33 = uVar51;
                        puVar33 = puVar33 + -1;
                        uVar39 = uVar39 - iVar21;
                        iVar60 = iVar60 + 1;
                      } while (iVar60 != 0);
                    }
                    iVar12 = iVar12 + iVar48;
                    iVar37 = iVar37 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                  iVar49 = iVar49 + (iVar41 - iVar46) * iVar48;
                }
                if (iVar41 != iVar42) {
                  iVar35 = (iVar41 - iVar35) * iVar11 + *local_3048 +
                           (((local_3020->xp).m_i - local_2fe0->m_i) * iVar28) /
                           (local_3018->m_i - (local_3028->xp).m_i);
                  iVar42 = iVar42 - iVar41;
                  pqVar17 = bits + (int)(iVar41 * width);
                  do {
                    uVar23 = iVar49 >> 8;
                    if (iVar49 >> 8 < 1) {
                      uVar23 = 0;
                    }
                    uVar51 = iVar35 >> 8;
                    uVar39 = width;
                    if ((int)uVar51 < (int)width) {
                      uVar39 = uVar51;
                    }
                    if ((int)uVar23 < (int)uVar39) {
                      uVar15 = (ulong)uVar23;
                      uVar23 = ((int)(((uVar23 * 0x100 - iVar49) + 0xff) * iVar21) >> 8) +
                               local_3098;
                      lVar20 = (long)(int)uVar51;
                      if (lVar61 < (int)uVar51) {
                        lVar20 = lVar61;
                      }
                      do {
                        uVar39 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar39 = uVar23;
                        }
                        uVar51 = pqVar17[uVar15];
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar39 < uVar40) {
                          uVar51 = uVar23;
                        }
                        pqVar17[uVar15] = uVar51;
                        uVar23 = uVar23 + iVar21;
                        uVar15 = uVar15 + 1;
                      } while ((int)lVar20 != (int)uVar15);
                    }
                    iVar49 = iVar49 + iVar48;
                    iVar35 = iVar35 + iVar11;
                    pqVar17 = pqVar17 + lVar61;
                    iVar42 = iVar42 + -1;
                  } while (iVar42 != 0);
                }
              }
              else {
                iVar50 = iVar50 + (iVar24 - iVar49) * iVar11 + (iVar54 * iVar26) / iVar60;
                iVar49 = iVar41 - iVar24;
                if (iVar49 != 0) {
                  iVar37 = ((local_309c - iVar14) * iVar22) / iVar36 + iVar37;
                  pqVar17 = local_2fd0 + (int)(iVar24 * width);
                  do {
                    iVar24 = iVar50 >> 8;
                    if (iVar50 >> 8 < 1) {
                      iVar24 = 0;
                    }
                    uVar23 = iVar37 >> 8;
                    if ((int)width <= iVar37 >> 8) {
                      uVar23 = width;
                    }
                    if (iVar24 < (int)uVar23) {
                      uVar39 = ((int)(((uVar23 * 0x100 - iVar37) + 0xff) * iVar21) >> 8) -
                               (local_3098 + iVar21);
                      puVar33 = (uint *)(pqVar17 + (int)uVar23);
                      iVar24 = iVar24 - uVar23;
                      do {
                        uVar23 = -uVar39;
                        if (0 < (int)uVar39) {
                          uVar23 = uVar39;
                        }
                        uVar51 = *puVar33;
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar23 < uVar40) {
                          uVar51 = uVar39;
                        }
                        *puVar33 = uVar51;
                        puVar33 = puVar33 + -1;
                        uVar39 = uVar39 - iVar21;
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != 0);
                    }
                    iVar50 = iVar50 + iVar11;
                    iVar37 = iVar37 + iVar48;
                    pqVar17 = pqVar17 + lVar61;
                    iVar49 = iVar49 + -1;
                  } while (iVar49 != 0);
                }
                iVar49 = iVar29 + (iVar41 - iVar35) * iVar11 + (iVar28 * iVar26) / iVar60;
                if (iVar41 != iVar46) {
                  iVar24 = iVar46 - iVar41;
                  pqVar17 = local_2fd0 + (int)(iVar41 * width);
                  iVar35 = (int)(((iVar41 << 8 | 0xffU) - local_3048[1]) * local_3098 * 2) /
                           (local_3018->m_i - (local_3028->xp).m_i) - iVar21;
                  do {
                    iVar41 = iVar50 >> 8;
                    if (iVar50 >> 8 < 1) {
                      iVar41 = 0;
                    }
                    uVar23 = iVar49 >> 8;
                    if ((int)width <= iVar49 >> 8) {
                      uVar23 = width;
                    }
                    if (iVar41 < (int)uVar23) {
                      puVar33 = (uint *)(pqVar17 + (int)uVar23);
                      iVar41 = iVar41 - uVar23;
                      uVar23 = ((int)(((uVar23 * 0x100 - iVar49) + 0xff) * iVar21) >> 8) + iVar35;
                      do {
                        uVar39 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar39 = uVar23;
                        }
                        uVar51 = *puVar33;
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar39 < uVar40) {
                          uVar51 = uVar23;
                        }
                        *puVar33 = uVar51;
                        puVar33 = puVar33 + -1;
                        uVar23 = uVar23 - iVar21;
                        iVar41 = iVar41 + 1;
                      } while (iVar41 != 0);
                    }
                    iVar50 = iVar50 + iVar11;
                    iVar49 = iVar49 + iVar11;
                    pqVar17 = pqVar17 + lVar61;
                    iVar35 = iVar35 + iVar12;
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                }
                iVar42 = iVar42 - iVar46;
                if (iVar42 != 0) {
                  iVar35 = (local_3020->xp).m_i;
                  iVar35 = ((iVar35 - local_3038->m_i) * iVar13) /
                           (local_3018->m_i - (local_2ff8->xp).m_i) + iVar35;
                  pqVar17 = bits + (int)(iVar46 * width);
                  do {
                    uVar23 = iVar35 >> 8;
                    if (iVar35 >> 8 < 1) {
                      uVar23 = 0;
                    }
                    uVar51 = iVar49 >> 8;
                    uVar39 = width;
                    if ((int)uVar51 < (int)width) {
                      uVar39 = uVar51;
                    }
                    if ((int)uVar23 < (int)uVar39) {
                      uVar15 = (ulong)uVar23;
                      uVar23 = ((int)(((uVar23 * 0x100 - iVar35) + 0xff) * iVar21) >> 8) +
                               local_3098;
                      lVar20 = (long)(int)uVar51;
                      if (lVar61 < (int)uVar51) {
                        lVar20 = lVar61;
                      }
                      do {
                        uVar39 = -uVar23;
                        if (0 < (int)uVar23) {
                          uVar39 = uVar23;
                        }
                        uVar51 = pqVar17[uVar15];
                        uVar40 = -uVar51;
                        if (0 < (int)uVar51) {
                          uVar40 = uVar51;
                        }
                        if (uVar39 < uVar40) {
                          uVar51 = uVar23;
                        }
                        pqVar17[uVar15] = uVar51;
                        uVar23 = uVar23 + iVar21;
                        uVar15 = uVar15 + 1;
                      } while ((int)lVar20 != (int)uVar15);
                    }
                    iVar35 = iVar35 + iVar48;
                    iVar49 = iVar49 + iVar11;
                    pqVar17 = pqVar17 + lVar61;
                    iVar42 = iVar42 + -1;
                  } while (iVar42 != 0);
                }
              }
            }
            if (*(char *)((long)local_2de8.super_QVLABaseBase.ptr + lVar31) == '\x01') {
              iVar49 = iVar25 * -0x1090 + iVar57 * 0x3dd2 >> 0xe;
              iVar48 = iVar25 * 0x3dd2 + iVar57 * 0x1090 >> 0xe;
              iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
              iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
              if (cVar2 == '\0') {
                if (iVar57 * iVar48 < iVar25 * iVar49) {
                  do {
                    local_2f50.yp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) -
                         iVar48;
                    local_2f50.xp.m_i =
                         *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) - iVar49;
                    drawTriangle<((anonymous_namespace)::FillClip)0>
                              (bits,width,
                               *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8),
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                               lVar31 * 8 + 4),&local_2f08,&local_2f50,0x7f80);
                    local_2f08 = local_2f50;
                    iVar19 = iVar48 * -0x1090 + iVar49 * 0x3dd2 >> 0xe;
                    iVar48 = iVar49 * 0x1090 + iVar48 * 0x3dd2 >> 0xe;
                    iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
                    iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                    iVar49 = iVar19;
                  } while (iVar57 * iVar48 < iVar25 * iVar19);
                }
                local_2f50.yp.m_i =
                     *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) - iVar25;
                local_2f50.xp.m_i =
                     *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) - iVar57;
                drawTriangle<((anonymous_namespace)::FillClip)0>
                          (bits,width,*(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8)
                           ,(QPoint *)
                            (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                            lVar31 * 8 + 4),&local_2f08,&local_2f50,0x7f80);
              }
              else {
                if (iVar57 * iVar48 < iVar25 * iVar49) {
                  do {
                    local_2f50.yp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) -
                         iVar48;
                    local_2f50.xp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) - iVar49;
                    drawTriangle<((anonymous_namespace)::FillClip)1>
                              (bits,width,iVar19,
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8
                                               ),
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                               lVar31 * 8 + 4),&local_2f08,(qint32)&local_2f50);
                    local_2f08 = local_2f50;
                    iVar35 = iVar48 * -0x1090 + iVar49 * 0x3dd2 >> 0xe;
                    iVar48 = iVar49 * 0x1090 + iVar48 * 0x3dd2 >> 0xe;
                    iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
                    iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                    iVar49 = iVar35;
                  } while (iVar57 * iVar48 < iVar25 * iVar35);
                }
                local_2f50.yp.m_i =
                     *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) - iVar25;
                local_2f50.xp.m_i =
                     *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) - iVar57;
                drawTriangle<((anonymous_namespace)::FillClip)1>
                          (bits,width,iVar19,
                           (QPoint *)
                           (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8),
                           (QPoint *)
                           (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4
                                           ),&local_2f08,(qint32)&local_2f50);
              }
            }
            else {
              iVar49 = iVar25 * 0x1090 + iVar57 * 0x3dd2 >> 0xe;
              iVar48 = iVar25 * 0x3dd2 + iVar57 * -0x1090 >> 0xe;
              iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
              iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
              if (cVar2 == '\0') {
                if (iVar25 * iVar49 < iVar57 * iVar48) {
                  do {
                    local_2f50.xp.m_i =
                         *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) + iVar49;
                    local_2f50.yp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) +
                         iVar48;
                    drawTriangle<((anonymous_namespace)::FillClip)0>
                              (bits,width,
                               *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8),
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                               lVar31 * 8 + 4),&local_2f50,(QPoint *)local_1c50,
                               -0x7f80);
                    local_1c50._0_4_ = local_2f50.xp.m_i;
                    local_1c50._4_4_ = local_2f50.yp.m_i;
                    iVar19 = iVar48 * 0x1090 + iVar49 * 0x3dd2 >> 0xe;
                    iVar48 = iVar49 * -0x1090 + iVar48 * 0x3dd2 >> 0xe;
                    iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
                    iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                    iVar49 = iVar19;
                  } while (iVar25 * iVar19 < iVar57 * iVar48);
                }
                local_2f50.yp.m_i =
                     iVar25 + *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                local_2f50.xp.m_i =
                     iVar57 + *(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8);
                drawTriangle<((anonymous_namespace)::FillClip)0>
                          (bits,width,*(int *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8)
                           ,(QPoint *)
                            (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                            lVar31 * 8 + 4),&local_2f50,(QPoint *)local_1c50,-0x7f80
                          );
              }
              else {
                if (iVar25 * iVar49 < iVar57 * iVar48) {
                  do {
                    local_2f50.xp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8) + iVar49;
                    local_2f50.yp.m_i =
                         *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4) +
                         iVar48;
                    drawTriangle<((anonymous_namespace)::FillClip)1>
                              (bits,width,iVar19,
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8
                                               ),
                               (QPoint *)
                               (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                               lVar31 * 8 + 4),&local_2f50,(qint32)local_1c50);
                    local_1c50._0_4_ = local_2f50.xp.m_i;
                    local_1c50._4_4_ = local_2f50.yp.m_i;
                    iVar35 = iVar48 * 0x1090 + iVar49 * 0x3dd2 >> 0xe;
                    iVar48 = iVar49 * -0x1090 + iVar48 * 0x3dd2 >> 0xe;
                    iVar57 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8);
                    iVar25 = *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                    iVar49 = iVar35;
                  } while (iVar25 * iVar35 < iVar57 * iVar48);
                }
                local_2f50.yp.m_i =
                     iVar25 + *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4);
                local_2f50.xp.m_i =
                     iVar57 + *(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8);
                drawTriangle<((anonymous_namespace)::FillClip)1>
                          (bits,width,iVar19,
                           (QPoint *)
                           (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8),
                           (QPoint *)
                           (ulong)*(uint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar31 * 8 + 4
                                           ),&local_2f50,(qint32)local_1c50);
              }
            }
            iVar57 = (int)local_2fa0;
            lVar20 = local_2fa0 + 1;
          } while (lVar20 < local_24b8.super_QVLABaseBase.s);
        }
        iVar19 = -local_2f94;
      } while (iVar19 < local_2f28.siz);
    }
    if (0 < (int)local_2ff0) {
      puVar18 = local_2fe8->data;
      iVar19 = 0;
      pqVar17 = bits;
      do {
        uVar15 = (ulong)width;
        if (0 < (int)width) {
          do {
            *puVar18 = (uchar)((uint)(0x7f80 - *pqVar17) >> 8);
            pqVar17 = pqVar17 + 1;
            puVar18 = puVar18 + 1;
            uVar23 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar23;
          } while (uVar23 != 0);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != (int)local_2ff0);
    }
    if ((undefined1 *)local_2f00.super_QVLABaseBase.ptr != local_2ee8) {
      QtPrivate::sizedFree(local_2f00.super_QVLABaseBase.ptr,local_2f00.super_QVLABaseBase.a);
    }
    if ((undefined1 *)local_2de8.super_QVLABaseBase.ptr != local_2dd0) {
      QtPrivate::sizedFree(local_2de8.super_QVLABaseBase.ptr,local_2de8.super_QVLABaseBase.a);
    }
    if ((undefined1 *)local_2cd0.super_QVLABaseBase.ptr != local_2cb8) {
      QtPrivate::sizedFree(local_2cd0.super_QVLABaseBase.ptr,local_2cd0.super_QVLABaseBase.a << 3);
    }
    if ((undefined1 *)local_24b8.super_QVLABaseBase.ptr != local_24a0) {
      QtPrivate::sizedFree(local_24b8.super_QVLABaseBase.ptr,local_24b8.super_QVLABaseBase.a << 3);
    }
    operator_delete__(bits);
  }
  if (local_2f48.buffer != (QPoint *)0x0) {
    QtPrivate::sizedFree(local_2f48.buffer,local_2f48.capacity << 3);
  }
  if (local_2f28.buffer != (uint *)0x0) {
    QtPrivate::sizedFree(local_2f28.buffer,local_2f28.capacity << 2);
  }
LAB_0047daea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_2fe8;
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(QSize size, const QPainterPath &path, bool doubleResolution)
{
    QDistanceFieldData *data = create(size);
    makeDistanceField(data,
                      path,
                      QT_DISTANCEFIELD_SCALE(doubleResolution),
                      QT_DISTANCEFIELD_RADIUS(doubleResolution) / QT_DISTANCEFIELD_SCALE(doubleResolution));
    return data;
}